

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,FunctionCallStmt *stmt)

{
  initializer_list<kratos::IRNode_*> __l;
  char cVar1;
  int iVar2;
  IRNodeKind IVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  StmtException *this_00;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  shared_ptr<kratos::FunctionCallVar> *__r;
  ostream *poVar6;
  shared_ptr<kratos::Var> local_c8;
  string local_b8;
  string_view local_98;
  undefined1 local_82;
  allocator<kratos::IRNode_*> local_81;
  FunctionCallStmt *local_80;
  FunctionCallStmt **local_78;
  size_type local_70;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_68;
  allocator<char> local_39;
  string local_38;
  FunctionCallStmt *local_18;
  FunctionCallStmt *stmt_local;
  SystemVerilogCodeGen *this_local;
  
  local_18 = stmt;
  stmt_local = (FunctionCallStmt *)this;
  iVar2 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[4])();
  IVar3 = IRNode::ir_node_kind((IRNode *)CONCAT44(extraout_var,iVar2));
  if (IVar3 != StmtKind) {
    local_82 = 1;
    this_00 = (StmtException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Function call statement cannot be used in top level",&local_39);
    local_80 = local_18;
    local_78 = &local_80;
    local_70 = 1;
    std::allocator<kratos::IRNode_*>::allocator(&local_81);
    __l._M_len = local_70;
    __l._M_array = (iterator)local_78;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_68,__l,&local_81);
    StmtException::StmtException(this_00,&local_38,&local_68);
    local_82 = 0;
    __cxa_throw(this_00,&StmtException::typeinfo,StmtException::~StmtException);
  }
  if ((this->generator_->debug & 1U) != 0) {
    uVar4 = Stream::line_no(&this->stream_);
    (local_18->super_Stmt).super_IRNode.verilog_ln = uVar4;
  }
  local_98 = indent(this);
  pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,local_98);
  __r = FunctionCallStmt::var(local_18);
  std::shared_ptr<kratos::Var>::shared_ptr<kratos::FunctionCallVar,void>(&local_c8,__r);
  Stream::var_str_abi_cxx11_(&local_b8,&this->stream_,&local_c8);
  std::operator<<(pbVar5,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::shared_ptr<kratos::Var>::~shared_ptr(&local_c8);
  poVar6 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,";");
  cVar1 = Stream::endl(&this->stream_);
  std::operator<<(poVar6,cVar1);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::FunctionCallStmt* stmt) {
    // since this is a statement, we don't allow it has return value
    // need to use it as a function call expr instead
    if (stmt->parent()->ir_node_kind() != IRNodeKind::StmtKind) {
        throw StmtException("Function call statement cannot be used in top level", {stmt});
    }
    if (generator_->debug) stmt->verilog_ln = stream_.line_no();
    stream_ << indent() << stream_.var_str(stmt->var());

    stream_ << ";" << stream_.endl();
}